

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

ssize_t __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::write
          (basic_writer<fmt::v6::buffer_range<wchar_t>_> *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  buffer<wchar_t> *pbVar2;
  size_t sVar3;
  wchar_t *pwVar4;
  int iVar5;
  long in_RAX;
  undefined4 extraout_var;
  long lVar6;
  undefined4 in_register_00000034;
  
  pbVar2 = (this->out_).container;
  sVar3 = pbVar2->size_;
  uVar1 = (long)__buf + sVar3;
  if (pbVar2->capacity_ < uVar1) {
    iVar5 = (**pbVar2->_vptr_buffer)(pbVar2,uVar1);
    in_RAX = CONCAT44(extraout_var,iVar5);
  }
  pbVar2->size_ = uVar1;
  if (0 < (long)__buf) {
    pwVar4 = pbVar2->ptr_;
    lVar6 = (long)__buf + 1;
    in_RAX = 0;
    do {
      pwVar4[sVar3 + in_RAX] = (int)*(char *)(CONCAT44(in_register_00000034,__fd) + in_RAX);
      lVar6 = lVar6 + -1;
      in_RAX = in_RAX + 1;
    } while (1 < lVar6);
  }
  return in_RAX;
}

Assistant:

void write(string_view value) {
    auto&& it = reserve(value.size());
    it = copy_str<char_type>(value.begin(), value.end(), it);
  }